

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O1

void __thiscall btSoftBody::applyForces(btSoftBody *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  Node *pNVar9;
  int faceIndex;
  long lVar10;
  long lVar11;
  long lVar12;
  btScalar bVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  CProfileManager::Start_Profile("SoftBody applyForces");
  fVar1 = (this->m_cfg).kDG;
  fVar2 = (this->m_cfg).kPR;
  fVar3 = (this->m_cfg).kVC;
  fVar4 = (this->m_cfg).kLF;
  if ((fVar2 == 0.0) && (!NAN(fVar2))) {
    fVar16 = 0.0;
    fVar15 = 0.0;
    if (fVar3 <= 0.0) goto LAB_001e2f6a;
  }
  bVar13 = getVolume(this);
  fVar16 = (1.0 / ABS(bVar13)) * fVar2;
  fVar15 = ((this->m_pose).m_volume - bVar13) * fVar3;
LAB_001e2f6a:
  lVar10 = (long)(this->m_nodes).m_size;
  if (0 < lVar10) {
    lVar11 = 0x40;
    lVar12 = 0;
    do {
      pNVar9 = (this->m_nodes).m_data;
      if (0.0 < *(float *)((long)(pNVar9->m_q).m_floats + lVar11)) {
        if (0.0 < fVar1 || 0.0 < fVar4) {
          addAeroForceToNode(this,&this->m_windVelocity,(int)lVar12);
        }
        if ((fVar2 != 0.0) || (NAN(fVar2))) {
          fVar14 = *(float *)((long)(pNVar9->m_q).m_floats + lVar11 + 4) * fVar16;
          fVar5 = *(float *)((long)(pNVar9->m_x).m_floats + lVar11 + 8);
          uVar6 = *(undefined8 *)
                   ((long)&(((Node *)(&pNVar9->m_x + -1))->super_Feature).super_Element.m_tag +
                   lVar11);
          uVar7 = *(undefined8 *)((long)(pNVar9->m_x).m_floats + lVar11);
          *(ulong *)((long)&(((Node *)(&pNVar9->m_x + -1))->super_Feature).super_Element.m_tag +
                    lVar11) =
               CONCAT44(fVar14 * (float)((ulong)uVar7 >> 0x20) + (float)((ulong)uVar6 >> 0x20),
                        fVar14 * (float)uVar7 + (float)uVar6);
          *(float *)((long)(pNVar9->m_x).m_floats + lVar11 + -8) =
               fVar5 * fVar14 + *(float *)((long)(pNVar9->m_x).m_floats + lVar11 + -8);
        }
        if (0.0 < fVar3) {
          fVar14 = *(float *)((long)(pNVar9->m_q).m_floats + lVar11 + 4) * fVar15;
          fVar5 = *(float *)((long)(pNVar9->m_x).m_floats + lVar11 + 8);
          uVar6 = *(undefined8 *)
                   ((long)&(((Node *)(&pNVar9->m_x + -1))->super_Feature).super_Element.m_tag +
                   lVar11);
          uVar7 = *(undefined8 *)((long)(pNVar9->m_x).m_floats + lVar11);
          *(ulong *)((long)&(((Node *)(&pNVar9->m_x + -1))->super_Feature).super_Element.m_tag +
                    lVar11) =
               CONCAT44(fVar14 * (float)((ulong)uVar7 >> 0x20) + (float)((ulong)uVar6 >> 0x20),
                        fVar14 * (float)uVar7 + (float)uVar6);
          *(float *)((long)(pNVar9->m_x).m_floats + lVar11 + -8) =
               fVar5 * fVar14 + *(float *)((long)(pNVar9->m_x).m_floats + lVar11 + -8);
        }
      }
      lVar12 = lVar12 + 1;
      lVar11 = lVar11 + 0x78;
    } while (lVar10 != lVar12);
  }
  iVar8 = (this->m_faces).m_size;
  if (0 < iVar8) {
    faceIndex = 0;
    do {
      addAeroForceToFace(this,&this->m_windVelocity,faceIndex);
      faceIndex = faceIndex + 1;
    } while (iVar8 != faceIndex);
  }
  CProfileManager::Stop_Profile();
  return;
}

Assistant:

void				btSoftBody::applyForces()
{

	BT_PROFILE("SoftBody applyForces");
//	const btScalar					dt =			m_sst.sdt;
	const btScalar					kLF =			m_cfg.kLF;
	const btScalar					kDG =			m_cfg.kDG;
	const btScalar					kPR =			m_cfg.kPR;
	const btScalar					kVC =			m_cfg.kVC;
	const bool						as_lift =		kLF>0;
	const bool						as_drag =		kDG>0;
	const bool						as_pressure =	kPR!=0;
	const bool						as_volume =		kVC>0;
	const bool						as_aero =		as_lift	||
													as_drag		;
	//const bool						as_vaero =		as_aero	&&
	//												(m_cfg.aeromodel < btSoftBody::eAeroModel::F_TwoSided);
	//const bool						as_faero =		as_aero	&&
	//												(m_cfg.aeromodel >= btSoftBody::eAeroModel::F_TwoSided);
	const bool						use_medium =	as_aero;
	const bool						use_volume =	as_pressure	||
		as_volume	;
	btScalar						volume =		0;
	btScalar						ivolumetp =		0;
	btScalar						dvolumetv =		0;
	btSoftBody::sMedium	medium;
	if(use_volume)
	{
		volume		=	getVolume();
		ivolumetp	=	1/btFabs(volume)*kPR;
		dvolumetv	=	(m_pose.m_volume-volume)*kVC;
	}
	/* Per vertex forces			*/ 
	int i,ni;

	for(i=0,ni=m_nodes.size();i<ni;++i)
	{
		btSoftBody::Node&	n=m_nodes[i];
		if(n.m_im>0)
		{
			if(use_medium)
			{
				/* Aerodynamics			*/ 
				addAeroForceToNode(m_windVelocity, i);
			}
			/* Pressure				*/ 
			if(as_pressure)
			{
				n.m_f	+=	n.m_n*(n.m_area*ivolumetp);
			}
			/* Volume				*/ 
			if(as_volume)
			{
				n.m_f	+=	n.m_n*(n.m_area*dvolumetv);
			}
		}
	}

	/* Per face forces				*/ 
	for(i=0,ni=m_faces.size();i<ni;++i)
	{
	//	btSoftBody::Face&	f=m_faces[i];

		/* Aerodynamics			*/ 
		addAeroForceToFace(m_windVelocity, i);	
	}
}